

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdClearWitnessStack(void *handle,void *create_handle,char *txid,uint32_t vout)

{
  pointer pcVar1;
  ConfidentialTransaction *this;
  _func_int *p_Var2;
  bool bVar3;
  uint32_t uVar4;
  CfdException *pCVar5;
  TransactionContext *tx;
  bool is_bitcoin;
  Txid txid_obj;
  allocator local_71;
  undefined1 local_70 [32];
  string local_50;
  
  cfd::Initialize();
  pcVar1 = local_70 + 0x10;
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"TransactionData","");
  cfd::capi::CheckBuffer(create_handle,(string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_);
  }
  bVar3 = cfd::capi::IsEmptyString(txid);
  if (bVar3) {
    local_70._0_8_ = "cfdcapi_transaction.cpp";
    local_70._8_4_ = 0x2ba;
    local_70._16_8_ = "CfdClearWitnessStack";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_50,txid,&local_71);
  cfd::core::Txid::Txid((Txid *)local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_71 = (allocator)0x0;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),(bool *)&local_71);
  this = *(ConfidentialTransaction **)((long)create_handle + 0x18);
  if (this != (ConfidentialTransaction *)0x0) {
    p_Var2 = (this->super_AbstractTransaction)._vptr_AbstractTransaction[2];
    if (local_71 == (allocator)0x1) {
      uVar4 = (*p_Var2)(this,local_70,(ulong)vout);
      cfd::core::Transaction::RemoveScriptWitnessStackAll((Transaction *)this,uVar4);
    }
    else {
      uVar4 = (*p_Var2)(this,local_70,(ulong)vout);
      cfd::core::ConfidentialTransaction::RemoveScriptWitnessStackAll(this,uVar4);
    }
    local_70._0_8_ = &PTR__Txid_00723450;
    if ((void *)CONCAT44(local_70._12_4_,local_70._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_70._12_4_,local_70._8_4_));
    }
    return 0;
  }
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,&local_50);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdClearWitnessStack(
    void* handle, void* create_handle, const char* txid, uint32_t vout) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    Txid txid_obj(txid);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->RemoveScriptWitnessStackAll(index);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->RemoveScriptWitnessStackAll(index);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}